

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O3

unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> __thiscall
duckdb::AtClause::Deserialize(AtClause *this,Deserializer *deserializer)

{
  int iVar1;
  AtClause *this_00;
  pointer *__ptr;
  ParsedExpression *pPVar2;
  type ret;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  pointer local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  ParsedExpression *local_50;
  string local_48;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,1,"unit");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_70 = &local_60;
    local_60._M_local_buf[0] = '\0';
    local_68 = (pointer)0x0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_70,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,2,"expr");
  if ((char)iVar1 == '\0') {
    pPVar2 = (ParsedExpression *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pPVar2 = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&local_50,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pPVar2 = local_50;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (AtClause *)operator_new(0x28);
  if (local_70 == &local_60) {
    local_48.field_2._8_8_ = local_60._8_8_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)local_70;
  }
  local_48.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_48.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_48._M_string_length = (size_type)local_68;
  local_68 = (pointer)0x0;
  local_60._M_local_buf[0] = '\0';
  local_78._M_head_impl = pPVar2;
  local_70 = &local_60;
  AtClause(this_00,&local_48,
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            *)&local_78);
  (this->unit)._M_dataplus._M_p = (pointer)this_00;
  if (local_78._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_78._M_head_impl = (ParsedExpression *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  return (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)
         (unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>)this;
}

Assistant:

unique_ptr<AtClause> AtClause::Deserialize(Deserializer &deserializer) {
	auto unit = deserializer.ReadPropertyWithDefault<string>(1, "unit");
	auto expr = deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(2, "expr");
	auto result = duckdb::unique_ptr<AtClause>(new AtClause(std::move(unit), std::move(expr)));
	return result;
}